

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O2

void Vec_QueMoveDown(Vec_Que_t *p,int v)

{
  int iVar1;
  float *pfVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pfVar2 = *p->pCostsFlt;
  if (pfVar2 == (float *)0x0) {
    fVar8 = (float)v;
  }
  else {
    fVar8 = pfVar2[v];
  }
  piVar3 = p->pOrder;
  uVar4 = piVar3[v];
  while( true ) {
    uVar5 = uVar4 * 2;
    iVar1 = p->nSize;
    if (iVar1 <= (int)uVar5) break;
    uVar7 = uVar5 | 1;
    if ((int)uVar7 < iVar1) {
      piVar6 = p->pHeap;
      if (pfVar2 == (float *)0x0) {
        fVar9 = (float)piVar6[(int)uVar5];
        fVar10 = (float)piVar6[(int)uVar7];
      }
      else {
        fVar9 = pfVar2[piVar6[(int)uVar5]];
        fVar10 = pfVar2[piVar6[(int)uVar7]];
      }
      if (fVar9 < fVar10) {
        uVar5 = uVar7;
      }
    }
    if (iVar1 <= (int)uVar5) {
      __assert_fail("child < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                    ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
    }
    piVar6 = p->pHeap;
    iVar1 = piVar6[(int)uVar5];
    if (pfVar2 == (float *)0x0) {
      fVar9 = (float)iVar1;
    }
    else {
      fVar9 = pfVar2[iVar1];
    }
    if (fVar9 <= fVar8) goto LAB_0053a91e;
    piVar6[(int)uVar4] = iVar1;
    piVar3[iVar1] = uVar4;
    uVar4 = uVar5;
  }
  piVar6 = p->pHeap;
LAB_0053a91e:
  piVar6[(int)uVar4] = v;
  piVar3[v] = uVar4;
  return;
}

Assistant:

static inline void Vec_QueMoveDown( Vec_Que_t * p, int v )
{
    float Cost = Vec_QuePrio(p, v);
    int i      = p->pOrder[v];
    int child  = i << 1;
    while ( child < p->nSize )
    {
        if ( child + 1 < p->nSize && Vec_QuePrio(p, p->pHeap[child]) < Vec_QuePrio(p, p->pHeap[child+1]) )
            child++;
        assert( child < p->nSize );
        if ( Cost >= Vec_QuePrio(p, p->pHeap[child]))
            break;
        p->pHeap[i]            = p->pHeap[child];
        p->pOrder[p->pHeap[i]] = i;
        i                      = child;
        child                  = child << 1;
    }
    p->pHeap[i]  = v;
    p->pOrder[v] = i;
}